

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::tuple_caster<std::pair,long,long>::load_impl<0ul,1ul>
          (tuple_caster<std::pair,long,long> *this,undefined8 *seq,bool convert)

{
  char *pcVar1;
  bool bVar2;
  object *poVar3;
  long lVar4;
  char local_71;
  object local_70;
  object local_68;
  accessor<pybind11::detail::accessor_policies::sequence_item> local_60;
  accessor<pybind11::detail::accessor_policies::sequence_item> local_40;
  
  local_40.obj.m_ptr = (PyObject *)*seq;
  local_40.key = 0;
  local_40.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  poVar3 = accessor<pybind11::detail::accessor_policies::sequence_item>::get_cache(&local_40);
  local_68.super_handle.m_ptr = (handle)(poVar3->super_handle).m_ptr;
  if (local_68.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_68.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_68.super_handle.m_ptr)->ob_refcnt + 1;
  }
  bVar2 = type_caster<long,_void>::load
                    ((type_caster<long,_void> *)this,local_68.super_handle,convert);
  local_60.obj.m_ptr = (PyObject *)*seq;
  local_60.key = 1;
  local_60.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  poVar3 = accessor<pybind11::detail::accessor_policies::sequence_item>::get_cache(&local_60);
  local_70.super_handle.m_ptr = (handle)(poVar3->super_handle).m_ptr;
  if (local_70.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_70.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_70.super_handle.m_ptr)->ob_refcnt + 1;
  }
  local_71 = type_caster<long,_void>::load
                       ((type_caster<long,_void> *)(this + 8),local_70.super_handle,convert);
  object::~object(&local_70);
  object::~object(&local_60.cache);
  object::~object(&local_68);
  object::~object(&local_40.cache);
  if (bVar2) {
    lVar4 = 0;
    do {
      bVar2 = lVar4 == 1;
      if (bVar2) {
        return bVar2;
      }
      pcVar1 = &local_71 + lVar4;
      lVar4 = lVar4 + 1;
    } while (*pcVar1 != '\0');
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load_impl(const sequence &seq, bool convert, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(subcasters).load(seq[Is], convert)))
            return false;
#else
        for (bool r : {std::get<Is>(subcasters).load(seq[Is], convert)...})
            if (!r)
                return false;
#endif
        return true;
    }